

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O3

cmFileLockResult __thiscall cmFileLockPool::Release(cmFileLockPool *this,string *filename)

{
  bool bVar1;
  cmFileLockResult cVar2;
  undefined8 uVar3;
  cmFileLockPool *pcVar5;
  _List_node_base *p_Var6;
  cmFileLockResult result;
  cmFileLockResult local_30;
  undefined8 uVar4;
  
  pcVar5 = this;
  do {
    pcVar5 = (cmFileLockPool *)
             (pcVar5->FunctionScopes).
             super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (pcVar5 == this) {
      p_Var6 = (_List_node_base *)&this->FileScopes;
      do {
        p_Var6 = (((_List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                    *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var6 == (_List_node_base *)&this->FileScopes) {
          cVar2 = ScopePool::Release(&this->ProcessScope,filename);
          uVar4._0_4_ = cVar2.Type;
          uVar4._4_4_ = cVar2.ErrorValue;
          return (cmFileLockResult)uVar4;
        }
        local_30 = ScopePool::Release((ScopePool *)p_Var6[1]._M_next,filename);
        bVar1 = cmFileLockResult::IsOk(&local_30);
      } while (bVar1);
      return local_30;
    }
    local_30 = ScopePool::Release((ScopePool *)
                                  (pcVar5->FunctionScopes).
                                  super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                                  ._M_impl._M_node._M_size,filename);
    bVar1 = cmFileLockResult::IsOk(&local_30);
  } while (bVar1);
  uVar3._0_4_ = local_30.Type;
  uVar3._4_4_ = local_30.ErrorValue;
  return (cmFileLockResult)uVar3;
}

Assistant:

cmFileLockResult cmFileLockPool::Release(const std::string& filename)
{
  for (It i = this->FunctionScopes.begin();
      i != this->FunctionScopes.end(); ++i)
    {
    const cmFileLockResult result = (*i)->Release(filename);
    if (!result.IsOk())
      {
      return result;
      }
    }

  for (It i = this->FileScopes.begin(); i != this->FileScopes.end(); ++i)
    {
    const cmFileLockResult result = (*i)->Release(filename);
    if (!result.IsOk())
      {
      return result;
      }
    }

  return this->ProcessScope.Release(filename);
}